

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ChargeStrengthSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ChargeStrengthSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  ChargeStrengthSyntax *pCVar16;
  
  pCVar16 = (ChargeStrengthSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ChargeStrengthSyntax *)this->endPtr < pCVar16 + 1) {
    pCVar16 = (ChargeStrengthSyntax *)allocateSlow(this,0x48,8);
  }
  else {
    this->head->current = (byte *)(pCVar16 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar1 = args->info;
  TVar8 = args_1->kind;
  uVar9 = args_1->field_0x2;
  NVar10.raw = (args_1->numFlags).raw;
  uVar11 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar12 = args_2->kind;
  uVar13 = args_2->field_0x2;
  NVar14.raw = (args_2->numFlags).raw;
  uVar15 = args_2->rawLen;
  pIVar3 = args_2->info;
  (pCVar16->super_NetStrengthSyntax).super_SyntaxNode.kind = ChargeStrength;
  (pCVar16->super_NetStrengthSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pCVar16->super_NetStrengthSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pCVar16->openParen).kind = TVar4;
  (pCVar16->openParen).field_0x2 = uVar5;
  (pCVar16->openParen).numFlags = (NumericTokenFlags)NVar6.raw;
  (pCVar16->openParen).rawLen = uVar7;
  (pCVar16->openParen).info = pIVar1;
  (pCVar16->strength).kind = TVar8;
  (pCVar16->strength).field_0x2 = uVar9;
  (pCVar16->strength).numFlags = (NumericTokenFlags)NVar10.raw;
  (pCVar16->strength).rawLen = uVar11;
  (pCVar16->strength).info = pIVar2;
  (pCVar16->closeParen).kind = TVar12;
  (pCVar16->closeParen).field_0x2 = uVar13;
  (pCVar16->closeParen).numFlags = (NumericTokenFlags)NVar14.raw;
  (pCVar16->closeParen).rawLen = uVar15;
  (pCVar16->closeParen).info = pIVar3;
  return pCVar16;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }